

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O3

void __thiscall
SquareRootUnscentedKalmanFilter_updateStateCovariance_Test::TestBody
          (SquareRootUnscentedKalmanFilter_updateStateCovariance_Test *this)

{
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar1;
  ActualDstType actualDst;
  undefined1 local_1e8 [8];
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  Matrix<T,_2,_2> Ssquared;
  Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> S_y;
  Scalar local_c0 [2];
  Matrix<T,_3,_2> K;
  Matrix<T,_3,_3> P;
  AssertionResult gtest_ar__1;
  
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x13] = 1.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaStatePoints.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>.m_storage.m_data.array[0x14] = 2.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.alpha = 1.0;
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::computeWeights
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_1e8);
  local_1e8._0_4_ = 0.0;
  local_1e8._4_4_ = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
  super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma = 1.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.lambda = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]._0_1_ = 1;
  unique0x00004880 =
       &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
        super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
        super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_info = 0x3f800000;
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] = 0.1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)
                      (P.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                       m_data.array + 8),
                      K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data
                      .array + 4);
  Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
       0.1;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar1,Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array + 2);
  local_c0[0] = 0.5;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar1,local_c0);
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 2>>::finished() [MatrixType = Eigen::Matrix<float, 2, 2>]"
               );
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, updateStateCovariance) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    // Setup S_y
    Matrix<T,2,2> Ssquared;
    Ssquared <<
        1, 0.1,
        0.1, 0.5;
    Cholesky<Matrix<T,2,2>> S_y;
    S_y.compute(0.1*Ssquared);
    ASSERT_TRUE(S_y.info() == Eigen::Success);
    
    // Setup Kalman Gain
    Matrix<T, 3, 2> K;
    K <<
        0.178408514951850, -0.304105423213381,
       -1.110998479472884,  0.802838317283324,
       -1.246156445345498,  0.063524243960128;
    
    // Setup S
    ukf.S.setIdentity();
    
    // Setup reference value for S (computed from regular UKF formula)
    Matrix<T,3,3> P_ref = ukf.S.reconstructedMatrix() - K * S_y.reconstructedMatrix() * K.transpose();

    // Perform update
    bool success = ukf.updateStateCovariance<Vector<T,2>>(K, S_y);
    ASSERT_TRUE(success);

    Matrix<T,3,3> P = ukf.S.reconstructedMatrix();
    
    ASSERT_MATRIX_NEAR(P_ref, P, 1e-6);
}